

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_gzip.c
# Opt level: O0

int archive_compressor_gzip_write(archive_write_filter *f,void *buff,size_t length)

{
  _func_int_archive_write_filter_ptr *p_Var1;
  ulong in_RDX;
  archive *in_RSI;
  long in_RDI;
  int ret;
  private_data_conflict4 *data;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  archive_write_filter *f_00;
  int local_4;
  
  f_00 = *(archive_write_filter **)(in_RDI + 0x40);
  p_Var1 = (_func_int_archive_write_filter_ptr *)crc32(f_00[1].close,in_RSI,in_RDX & 0xffffffff);
  f_00[1].close = p_Var1;
  f_00[1].options = f_00[1].options + in_RDX;
  f_00->archive = in_RSI;
  *(int *)&f_00->next_filter = (int)in_RDX;
  local_4 = drive_compressor(f_00,(private_data_conflict4 *)
                                  CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc);
  if (local_4 == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
archive_compressor_gzip_write(struct archive_write_filter *f, const void *buff,
    size_t length)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	/* Update statistics */
	data->crc = crc32(data->crc, (const Bytef *)buff, (uInt)length);
	data->total_in += length;

	/* Compress input data to output buffer */
	SET_NEXT_IN(data, buff);
	data->stream.avail_in = (uInt)length;
	if ((ret = drive_compressor(f, data, 0)) != ARCHIVE_OK)
		return (ret);

	return (ARCHIVE_OK);
}